

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O2

int32_t ustrcase_internalToUpper_63
                  (int32_t caseLocale,uint32_t options,BreakIterator *param_3,UChar *dest,
                  int32_t destCapacity,UChar *src,int32_t srcLength,Edits *edits,
                  UErrorCode *errorCode)

{
  char cVar1;
  UChar UVar2;
  ushort uVar3;
  int32_t iVar4;
  uint uVar5;
  int destIndex;
  int32_t destIndex_00;
  undefined1 *puVar6;
  UTrie2 *pUVar7;
  uint uVar8;
  uint uVar9;
  short sVar10;
  uint c;
  UChar *local_58;
  UChar *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (caseLocale != 4) {
    local_38 = 0;
    local_48 = 0;
    uStack_40 = (ulong)(uint)srcLength;
    if (caseLocale == 2) {
      puVar6 = icu_63::LatinCase::TO_UPPER_TR;
    }
    else {
      puVar6 = icu_63::LatinCase::TO_UPPER_NORMAL;
    }
    local_50 = src;
    pUVar7 = ucase_getTrie_63();
    destIndex = 0;
    uVar8 = 0;
    uVar5 = 0;
LAB_002db944:
    do {
      while( true ) {
        uVar9 = uVar8;
        if (srcLength <= (int)uVar9) {
          iVar4 = icu_63::anon_unknown_9::appendUnchanged
                            (dest,destIndex,destCapacity,src + (int)uVar5,uVar9 - uVar5,options,
                             edits);
          if (iVar4 < 0) {
            *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            iVar4 = 0;
          }
          goto LAB_002dbc38;
        }
        UVar2 = src[(int)uVar9];
        c = (uint)(ushort)UVar2;
        if (0x17e < (ushort)UVar2) break;
        cVar1 = puVar6[(ushort)UVar2];
        sVar10 = (short)cVar1;
        if (cVar1 == -0x80) {
LAB_002dba3c:
          uVar8 = uVar9 + 1;
          uStack_40 = CONCAT44(uVar9,(undefined4)uStack_40);
          if (((((ushort)UVar2 & 0xfc00) == 0xd800) && ((int)uVar8 < srcLength)) &&
             (((ushort)src[(int)uVar8] & 0xfc00) == 0xdc00)) {
            c = (uint)(ushort)UVar2 * 0x400 + (uint)(ushort)src[(int)uVar8] + 0xfca02400;
            uVar8 = uVar9 + 2;
          }
          local_38 = CONCAT44(local_38._4_4_,uVar8);
          iVar4 = ucase_toFullUpper_63
                            (c,icu_63::anon_unknown_9::utf16_caseContextIterator,&local_50,&local_58
                             ,caseLocale);
          if ((-1 < iVar4) &&
             ((destIndex_00 = icu_63::anon_unknown_9::appendUnchanged
                                        (dest,destIndex,destCapacity,src + (int)uVar5,uVar9 - uVar5,
                                         options,edits), destIndex_00 < 0 ||
              (destIndex = icu_63::anon_unknown_9::appendResult
                                     (dest,destIndex_00,destCapacity,iVar4,local_58,uVar8 - uVar9,
                                      options,edits), uVar5 = uVar8, destIndex < 0))))
          goto LAB_002dbc1f;
        }
        else {
          uVar8 = uVar9 + 1;
          if (cVar1 != '\0') goto LAB_002db9d6;
        }
      }
      if ((0xd7ff < (ushort)UVar2) ||
         (uVar3 = pUVar7->index
                  [((ushort)UVar2 & 0x1f) + (uint)pUVar7->index[(ushort)UVar2 >> 5] * 4],
         (uVar3 & 8) != 0)) goto LAB_002dba3c;
      uVar8 = uVar9 + 1;
    } while (uVar3 < 0x80 || (uVar3 & 3) != 1);
    sVar10 = (short)((uint)(int)(short)uVar3 >> 7);
LAB_002db9d6:
    uVar8 = uVar9 + 1;
    uVar5 = icu_63::anon_unknown_9::appendUnchanged
                      (dest,destIndex,destCapacity,src + (int)uVar5,~uVar5 + uVar8,options,edits);
    if (-1 < (int)uVar5) {
      if ((int)uVar5 < destCapacity) {
        dest[uVar5] = sVar10 + UVar2;
LAB_002dbaac:
        destIndex = uVar5 + 1;
      }
      else {
        destIndex = -1;
        if (uVar5 != 0x7fffffff) goto LAB_002dbaac;
      }
      if (edits != (Edits *)0x0) {
        icu_63::Edits::addReplace(edits,1,1);
      }
      uVar5 = uVar8;
      if (-1 < destIndex) goto LAB_002db944;
    }
    *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    goto LAB_002dbc30;
  }
  iVar4 = icu_63::GreekUpper::toUpper(options,dest,destCapacity,src,srcLength,edits,errorCode);
LAB_002dbc38:
  icu_63::anon_unknown_9::checkOverflowAndEditsError(iVar4,destCapacity,edits,errorCode);
  return iVar4;
LAB_002dbc1f:
  *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
LAB_002dbc30:
  iVar4 = 0;
  goto LAB_002dbc38;
}

Assistant:

U_CFUNC int32_t U_CALLCONV
ustrcase_internalToUpper(int32_t caseLocale, uint32_t options, UCASEMAP_BREAK_ITERATOR_UNUSED
                         UChar *dest, int32_t destCapacity,
                         const UChar *src, int32_t srcLength,
                         icu::Edits *edits,
                         UErrorCode &errorCode) {
    int32_t destIndex;
    if (caseLocale == UCASE_LOC_GREEK) {
        destIndex = GreekUpper::toUpper(options, dest, destCapacity,
                                        src, srcLength, edits, errorCode);
    } else {
        UCaseContext csc=UCASECONTEXT_INITIALIZER;
        csc.p=(void *)src;
        csc.limit=srcLength;
        destIndex = toUpper(
            caseLocale, options,
            dest, destCapacity,
            src, &csc, srcLength,
            edits, errorCode);
    }
    return checkOverflowAndEditsError(destIndex, destCapacity, edits, errorCode);
}